

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

void __thiscall DConversationMenu::Drawer(DConversationMenu *this)

{
  uint uVar1;
  int iVar2;
  FStrifeDialogueNode *pFVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  char *string;
  FBrokenLines *pFVar9;
  int iVar10;
  long lVar11;
  FTexture *img;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  char tbuf [16];
  
  if (this->mDialogueLines == (FBrokenLines *)0x0) {
    __assert_fail("mDialogueLines != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_conversation.cpp"
                  ,0x3d8,"virtual void DConversationMenu::Drawer()");
  }
  pFVar3 = this->mCurNode;
  if (pFVar3 == (FStrifeDialogueNode *)0x0) {
    __assert_fail("mCurNode != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_conversation.cpp"
                  ,0x3d9,"virtual void DConversationMenu::Drawer()");
  }
  if (((ConversationPauseTic < gametic) && (!multiplayer)) && ((level.flags2._2_1_ & 0x10) == 0)) {
    menuactive = MENU_On;
  }
  lVar11 = (long)consoleplayer;
  uVar1 = (pFVar3->Backdrop).texnum;
  if (0 < (long)(int)uVar1) {
    if (uVar1 < TexMan.Textures.Count) {
      img = TexMan.Textures.Array[TexMan.Translation.Array[(int)uVar1]].Texture;
    }
    else {
      img = (FTexture *)0x0;
    }
    DCanvas::DrawTexture((DCanvas *)screen,img,0.0,0.0,0x40001391,1,0);
  }
  iVar5 = CleanYfac;
  iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar12 = ((screen->super_DSimpleCanvas).super_DCanvas.Height << 4) / 200;
  string = pFVar3->SpeakerName;
  if (string == (char *)0x0) {
    string = AActor::GetTag((AActor *)(&DAT_017e20c0)[lVar11 * 0x54],"Person");
  }
  else if (*string == '$') {
    string = FStringTable::operator()(&GStrings,string + 1);
  }
  if ((pFVar3->Backdrop).texnum < 1) {
    pFVar9 = this->mDialogueLines;
    iVar7 = iVar5 * -10;
    do {
      iVar7 = iVar7 + iVar5 * 10;
      piVar6 = &pFVar9->Width;
      pFVar9 = pFVar9 + 1;
    } while (-1 < *piVar6);
    iVar8 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar4 = iVar8 * 0xe;
    iVar10 = (int)((ulong)((long)iVar4 * -0x66666667) >> 0x20);
    if (string != (char *)0x0) {
      iVar7 = (iVar5 * 0x1e >> 1) + iVar7;
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
              (0x3ee66666,screen,0,(ulong)(uint)(iVar4 / 0x140),
               (ulong)(uint)(((screen->super_DSimpleCanvas).super_DCanvas.Height * 0xd) / 200),
               (ulong)(uint)(((iVar10 >> 7) - (iVar10 >> 0x1f)) + (iVar8 * 0x134) / 0x140),
               (ulong)(uint)(CleanYfac * 6 + iVar7));
  }
  iVar8 = OptionSettings.mLinespacing * (this->mResponseLines).Count + 4;
  iVar7 = 200 - this->mYpos;
  if (iVar8 < iVar7) {
    iVar7 = iVar8;
  }
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
            (0x3ee66666,screen,0,
             (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Width / 2 + CleanXfac * -0x88
                          ),
             (ulong)(uint)((screen->super_DSimpleCanvas).super_DCanvas.Height / 2 +
                          (this->mYpos + -0x66) * CleanYfac),(ulong)(uint)(CleanXfac * 0x110),
             (ulong)(uint)(iVar7 * CleanYfac));
  if (string != (char *)0x0) {
    DCanvas::DrawText((DCanvas *)screen,SmallFont,9,iVar2 / 0x14,iVar12,string,0x40001393,1,0);
    iVar12 = (iVar5 * 0x1e >> 1) + iVar12;
  }
  pFVar9 = this->mDialogueLines;
  if (-1 < pFVar9->Width) {
    iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    lVar11 = 0x10;
    do {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,(iVar2 * 0x18) / 0x140,iVar12,
                        (pFVar9->Text).Chars,0x40001393,1,0);
      iVar12 = iVar12 + iVar5 * 10;
      pFVar9 = (FBrokenLines *)((long)&this->mDialogueLines->Width + lVar11);
      piVar6 = (int *)((long)&this->mDialogueLines->Width + lVar11);
      lVar11 = lVar11 + 0x10;
    } while (-1 < *piVar6);
  }
  iVar2 = OptionSettings.mLinespacing;
  if ((this->mResponseLines).Count != 0) {
    iVar12 = this->mYpos;
    iVar7 = OptionSettings.mLinespacing / 2;
    uVar13 = 0;
    iVar5 = 0;
    do {
      FFont::StringWidth(SmallFont,(BYTE *)(this->mResponseLines).Array[uVar13].Chars);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,3,0x40,iVar12,
                        (this->mResponseLines).Array[uVar13].Chars,0x40001390,1,0);
      if (uVar13 == (this->mResponses).Array[iVar5]) {
        iVar10 = iVar5 + 1;
        mysnprintf(tbuf,0x10,"%d.");
        iVar8 = FFont::StringWidth(SmallFont,(BYTE *)tbuf);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,2,0x32 - iVar8,iVar12,tbuf,0x40001390,1,0);
        bVar14 = iVar5 == mSelection;
        iVar5 = iVar10;
        if (bVar14) {
          DCanvas::DrawText((DCanvas *)screen,ConFont,
                            (uint)((DConversationMenu *)DMenu::CurrentMenu != this ||
                                  DMenu::MenuTime % 8 < 4) * 4 + 2,
                            (screen->super_DSimpleCanvas).super_DCanvas.Width / 2 +
                            CleanXfac * -0x6b,
                            (screen->super_DSimpleCanvas).super_DCanvas.Height / 2 +
                            (iVar7 + -0x69 + iVar12) * CleanYfac,"\r",0x400013b8,
                            (ulong)(uint)(CleanXfac << 3),0x400013b9,(ulong)(uint)(CleanYfac << 3),0
                           );
        }
      }
      uVar13 = uVar13 + 1;
      iVar12 = iVar12 + iVar2;
    } while (uVar13 < (this->mResponseLines).Count);
  }
  return;
}

Assistant:

void Drawer()
	{
		const char *speakerName;
		int x, y, linesize;
		int width, fontheight;

		player_t *cp = &players[consoleplayer];

		assert (mDialogueLines != NULL);
		assert (mCurNode != NULL);

		FStrifeDialogueNode *CurNode = mCurNode;

		if (CurNode == NULL)
		{
			Close ();
			return;
		}

		// [CW] Freeze the game depending on MAPINFO options.
		if (ConversationPauseTic < gametic && !multiplayer && !(level.flags2 & LEVEL2_CONV_SINGLE_UNFREEZE))
		{
			menuactive = MENU_On;
		}

		if (CurNode->Backdrop.isValid())
		{
			screen->DrawTexture (TexMan(CurNode->Backdrop), 0, 0, DTA_320x200, true, TAG_DONE);
		}
		x = 16 * screen->GetWidth() / 320;
		y = 16 * screen->GetHeight() / 200;
		linesize = 10 * CleanYfac;

		// Who is talking to you?
		if (CurNode->SpeakerName != NULL)
		{
			speakerName = CurNode->SpeakerName;
			if (speakerName[0] == '$') speakerName = GStrings(speakerName+1);
		}
		else
		{
			speakerName = cp->ConversationNPC->GetTag("Person");
		}

		// Dim the screen behind the dialogue (but only if there is no backdrop).
		if (!CurNode->Backdrop.isValid())
		{
			int i;
			for (i = 0; mDialogueLines[i].Width >= 0; ++i)
			{ }
			screen->Dim (0, 0.45f, 14 * screen->GetWidth() / 320, 13 * screen->GetHeight() / 200,
				308 * screen->GetWidth() / 320 - 14 * screen->GetWidth () / 320,
				speakerName == NULL ? linesize * i + 6 * CleanYfac
				: linesize * i + 6 * CleanYfac + linesize * 3/2);
		}

		// Dim the screen behind the PC's choices.

		screen->Dim (0, 0.45f, (24-160) * CleanXfac + screen->GetWidth()/2,
			(mYpos - 2 - 100) * CleanYfac + screen->GetHeight()/2,
			272 * CleanXfac,
			MIN<int>(mResponseLines.Size() * OptionSettings.mLinespacing + 4, 200 - mYpos) * CleanYfac);

		if (speakerName != NULL)
		{
			screen->DrawText (SmallFont, CR_WHITE, x, y, speakerName,
				DTA_CleanNoMove, true, TAG_DONE);
			y += linesize * 3 / 2;
		}
		x = 24 * screen->GetWidth() / 320;
		for (int i = 0; mDialogueLines[i].Width >= 0; ++i)
		{
			screen->DrawText (SmallFont, CR_UNTRANSLATED, x, y, mDialogueLines[i].Text,
				DTA_CleanNoMove, true, TAG_DONE);
			y += linesize;
		}

		if (ShowGold)
		{
			auto cointype = PClass::FindActor("Coin");
			if (cointype)
			{
				AInventory *coin = cp->ConversationPC->FindInventory(cointype);
				char goldstr[32];

				mysnprintf(goldstr, countof(goldstr), "%d", coin != NULL ? coin->Amount : 0);
				screen->DrawText(SmallFont, CR_GRAY, 21, 191, goldstr, DTA_320x200, true,
					DTA_FillColor, 0, DTA_AlphaF, HR_SHADOW, TAG_DONE);
				screen->DrawTexture(TexMan(((AInventory *)GetDefaultByType(cointype))->Icon),
					3, 190, DTA_320x200, true,
					DTA_FillColor, 0, DTA_AlphaF, HR_SHADOW, TAG_DONE);
				screen->DrawText(SmallFont, CR_GRAY, 20, 190, goldstr, DTA_320x200, true, TAG_DONE);
				screen->DrawTexture(TexMan(((AInventory *)GetDefaultByType(cointype))->Icon),
					2, 189, DTA_320x200, true, TAG_DONE);
			}
		}

		y = mYpos;
		fontheight = OptionSettings.mLinespacing;

		int response = 0;
		for (unsigned i = 0; i < mResponseLines.Size(); i++, y += fontheight)
		{
			width = SmallFont->StringWidth(mResponseLines[i]);
			x = 64;

			screen->DrawText (SmallFont, CR_GREEN, x, y, mResponseLines[i], DTA_Clean, true, TAG_DONE);

			if (i == mResponses[response])
			{
				char tbuf[16];

				response++;
				mysnprintf (tbuf, countof(tbuf), "%d.", response);
				x = 50 - SmallFont->StringWidth (tbuf);
				screen->DrawText (SmallFont, CR_GREY, x, y, tbuf, DTA_Clean, true, TAG_DONE);

				if (response == mSelection+1)
				{
					int color = ((DMenu::MenuTime%8) < 4) || DMenu::CurrentMenu != this ? CR_RED:CR_GREY;

					x = (50 + 3 - 160) * CleanXfac + screen->GetWidth() / 2;
					int yy = (y + fontheight/2 - 5 - 100) * CleanYfac + screen->GetHeight() / 2;
					screen->DrawText (ConFont, color, x, yy, "\xd",
						DTA_CellX, 8 * CleanXfac,
						DTA_CellY, 8 * CleanYfac,
						TAG_DONE);
				}
			}
		}
	}